

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::BoolParseTester::Clear(BoolParseTester *this)

{
  uint32_t *puVar1;
  uint32_t cached_has_bits;
  BoolParseTester *this_local;
  
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  google::protobuf::RepeatedField<bool>::Clear(&(this->field_0)._impl_.repeated_bool_lowfield_);
  google::protobuf::RepeatedField<bool>::Clear(&(this->field_0)._impl_.packed_bool_lowfield_);
  google::protobuf::RepeatedField<bool>::Clear(&(this->field_0)._impl_.repeated_bool_midfield_);
  google::protobuf::RepeatedField<bool>::Clear(&(this->field_0)._impl_.packed_bool_midfield_);
  google::protobuf::RepeatedField<bool>::Clear(&(this->field_0)._impl_.repeated_bool_hifield_);
  google::protobuf::RepeatedField<bool>::Clear(&(this->field_0)._impl_.packed_bool_hifield_);
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 0xf) != 0) {
    memset((void *)((long)&this->field_0 + 0x80),0,9);
  }
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void BoolParseTester::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.BoolParseTester)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.repeated_bool_lowfield_.Clear();
  _impl_.packed_bool_lowfield_.Clear();
  _impl_.repeated_bool_midfield_.Clear();
  _impl_.packed_bool_midfield_.Clear();
  _impl_.repeated_bool_hifield_.Clear();
  _impl_.packed_bool_hifield_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    ::memset(&_impl_.optional_bool_lowfield_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_bool_hifield_) -
        reinterpret_cast<char*>(&_impl_.optional_bool_lowfield_)) + sizeof(_impl_.optional_bool_hifield_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}